

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::write_float<char,fmt::v11::basic_appender<char>,double>
          (basic_appender<char> out,double value,format_specs specs,locale_ref loc)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  basic_appender<char> bVar3;
  buffer<char> *buf;
  sign s;
  ulong uVar4;
  sign in_R9D;
  char precision [4];
  decimal_fp<double> dVar5;
  format_specs specs_00;
  format_specs specs_01;
  big_decimal_fp f;
  memory_buffer buffer;
  undefined1 local_270 [12];
  char acStack_264 [4];
  double local_260;
  big_decimal_fp local_258;
  buffer<char> local_248;
  char local_228 [512];
  
  local_248.size_._4_4_ = (undefined4)((ulong)local_248.ptr_ >> 0x20);
  register0x00000010 = specs._8_8_;
  local_270._0_8_ = specs.super_basic_specs;
  s = minus;
  if (-1 < (long)value) {
    s = specs.super_basic_specs.data_ >> 10 & space;
  }
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    bVar3.container._1_7_ = 0;
    bVar3.container._0_1_ = NAN(value);
    specs_01.width = s;
    specs_01.super_basic_specs = register0x00000010;
    specs_01.precision = 0;
    bVar3 = write_nonfinite<char,fmt::v11::basic_appender<char>>
                      (out.container,bVar3,specs.super_basic_specs.data_._0_1_,specs_01,in_R9D);
    return (basic_appender<char>)bVar3.container;
  }
  local_260 = value;
  if ((s != none) && ((specs.super_basic_specs.data_ & 0x38) == 0x20)) {
    uVar4 = (out.container)->size_ + 1;
    if ((out.container)->capacity_ < uVar4) {
      (*(out.container)->grow_)(out.container,uVar4);
    }
    sVar1 = (out.container)->size_;
    (out.container)->size_ = sVar1 + 1;
    (out.container)->ptr_[sVar1] = (char)(0x202b2d00 >> (sbyte)(s << 3));
    s = none;
    if (local_270._8_4_ != 0) {
      local_270._8_4_ = local_270._8_4_ - 1;
    }
  }
  precision = acStack_264;
  if (((long)stack0xfffffffffffffd98 < 0) &&
     (precision[0] = '\x06', precision[1] = '\0', precision[2] = '\0', precision[3] = '\0',
     (local_270._0_8_ & 7) == 0)) {
    dVar5 = dragonbox::to_decimal<double>(local_260);
    local_248._0_12_ = dVar5._0_12_;
    bVar3 = do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
                      (out,&local_248,(format_specs *)local_270,s,0x10,loc);
    return (basic_appender<char>)bVar3.container;
  }
  local_248.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_248.size_ = 0;
  local_248.ptr_ = local_228;
  local_248.capacity_ = 500;
  buf = (buffer<char> *)(local_270._0_8_ & 0xffffffff);
  if (((byte)local_270._0_8_ & 7) == 1) {
    if (precision == (char  [4])0x7fffffff) {
      report_error("number is too big");
    }
    precision = (char  [4])((int)precision + 1);
LAB_00145403:
    if (acStack_264 != (char  [4])0x0) {
      local_270._0_8_ = local_270._0_8_ | 0x2000;
    }
  }
  else {
    if ((local_270._0_4_ & 7) == 2) goto LAB_00145403;
    if ((local_270._0_4_ & 7) == 4) {
      if (s != none) {
        local_248.size_ = 0;
        buf = (buffer<char> *)local_248.size_;
        local_248.size_ = 1;
        local_228[0] = (char)(0x202b2d00 >> (sbyte)(s << 3));
      }
      local_248.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
      local_248.capacity_ = 500;
      specs_00._8_8_ = &local_248;
      specs_00.super_basic_specs = stack0xfffffffffffffd98;
      format_hexfloat<double,_0>((detail *)local_270._0_8_,local_260,specs_00,buf);
      auVar2 = (undefined1  [16])local_248._0_16_;
      sVar1 = local_248.size_;
      local_258.significand = local_248.ptr_;
      local_258.significand_size = (undefined4)local_248.size_;
      local_258.exponent = local_248.size_._4_4_;
      local_248._0_16_ = auVar2;
      bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,fmt::v11::basic_string_view<char>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (out,(format_specs *)local_270,sVar1,sVar1,
                         (anon_class_16_1_a7b7af8b *)&local_258);
      goto LAB_00145468;
    }
    precision = (char  [4])((int)precision + (uint)(precision == (char  [4])0x0));
  }
  local_258.exponent =
       format_float<double>(local_260,(int)precision,(format_specs *)local_270,false,&local_248);
  acStack_264[0] = precision[0];
  acStack_264[1] = precision[1];
  acStack_264[2] = precision[2];
  acStack_264[3] = precision[3];
  local_258.significand = local_248.ptr_;
  local_258.significand_size = (undefined4)local_248.size_;
  bVar3 = do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
                    (out,&local_258,(format_specs *)local_270,s,0x10,loc);
LAB_00145468:
  if (local_248.ptr_ != local_228) {
    free(local_248.ptr_);
  }
  return (basic_appender<char>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value, format_specs specs,
                                 locale_ref loc) -> OutputIt {
  // Use signbit because value < 0 is false for NaN.
  sign s = detail::signbit(value) ? sign::minus : specs.sign();

  if (!detail::isfinite(value))
    return write_nonfinite<Char>(out, detail::isnan(value), specs, s);

  if (specs.align() == align::numeric && s != sign::none) {
    *out++ = detail::getsign<Char>(s);
    s = sign::none;
    if (specs.width != 0) --specs.width;
  }

  constexpr int exp_upper = detail::exp_upper<T>();
  int precision = specs.precision;
  if (precision < 0) {
    if (specs.type() != presentation_type::none) {
      precision = 6;
    } else if (is_fast_float<T>::value && !is_constant_evaluated()) {
      // Use Dragonbox for the shortest format.
      using floaty = conditional_t<sizeof(T) >= sizeof(double), double, float>;
      auto dec = dragonbox::to_decimal(static_cast<floaty>(value));
      return write_float<Char>(out, dec, specs, s, exp_upper, loc);
    }
  }

  memory_buffer buffer;
  if (specs.type() == presentation_type::hexfloat) {
    if (s != sign::none) buffer.push_back(detail::getsign<char>(s));
    format_hexfloat(convert_float(value), specs, buffer);
    return write_bytes<Char, align::right>(out, {buffer.data(), buffer.size()},
                                           specs);
  }

  if (specs.type() == presentation_type::exp) {
    if (precision == max_value<int>())
      report_error("number is too big");
    else
      ++precision;
    if (specs.precision != 0) specs.set_alt();
  } else if (specs.type() == presentation_type::fixed) {
    if (specs.precision != 0) specs.set_alt();
  } else if (precision == 0) {
    precision = 1;
  }
  int exp = format_float(convert_float(value), precision, specs,
                         std::is_same<T, float>(), buffer);

  specs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float<Char>(out, f, specs, s, exp_upper, loc);
}